

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O3

void rrot8(void *blob,int len,int c)

{
  undefined1 uVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  int iVar19;
  int nbytes;
  uint8_t *k;
  ulong uVar20;
  uint uVar21;
  ushort uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar39 [64];
  
  if (c != 0) {
    iVar19 = c + 7;
    if (-1 < c) {
      iVar19 = c;
    }
    if (7 < c) {
      iVar19 = iVar19 >> 3;
      do {
        uVar1 = *blob;
        if (1 < len) {
          memmove(blob,(void *)((long)blob + 1),(ulong)(len - 1U));
        }
        iVar19 = iVar19 + -1;
        *(undefined1 *)((long)blob + (long)(int)(len - 1U)) = uVar1;
      } while (iVar19 != 0);
    }
    if (((c & 7U) != 0) && (0 < len)) {
      auVar25 = vpbroadcastb_avx512bw(ZEXT116(*blob));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar28 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar5 = vpand_avx(ZEXT416((uint)c),_DAT_001a0ac0);
      auVar34 = vmovdqa64_avx512f(_DAT_001a0a00);
      auVar35 = vpbroadcastq_avx512f(ZEXT816(0x40));
      auVar36 = vpbroadcastq_avx512f();
      auVar37 = vpbroadcastq_avx512f();
      uVar18 = 0;
      do {
        uVar10 = vpcmpuq_avx512f(auVar33,auVar36,2);
        uVar11 = vpcmpuq_avx512f(auVar32,auVar36,2);
        uVar12 = vpcmpuq_avx512f(auVar30,auVar36,2);
        uVar13 = vpcmpuq_avx512f(auVar26,auVar36,2);
        bVar3 = (byte)uVar13;
        uVar13 = vpcmpeqq_avx512f(auVar26,auVar37);
        auVar26 = vpaddq_avx512f(auVar26,auVar35);
        uVar14 = vpcmpuq_avx512f(auVar31,auVar36,2);
        uVar15 = vpcmpuq_avx512f(auVar28,auVar36,2);
        uVar16 = vpcmpuq_avx512f(auVar29,auVar36,2);
        uVar17 = vpcmpuq_avx512f(auVar27,auVar36,2);
        uVar22 = CONCAT11(bVar3,(byte)uVar17);
        uVar6 = vpcmpeqq_avx512f(auVar30,auVar37);
        auVar30 = vpaddq_avx512f(auVar30,auVar35);
        uVar21 = CONCAT22(uVar22,CONCAT11((byte)uVar15,(byte)uVar16));
        uVar7 = vpcmpeqq_avx512f(auVar32,auVar37);
        auVar32 = vpaddq_avx512f(auVar32,auVar35);
        uVar24 = CONCAT44(uVar21,CONCAT22(CONCAT11((byte)uVar12,(byte)uVar14),
                                          CONCAT11((byte)uVar11,(byte)uVar10)));
        uVar8 = vpcmpeqq_avx512f(auVar33,auVar37);
        auVar33 = vpaddq_avx512f(auVar33,auVar35);
        uVar9 = vpcmpeqq_avx512f(auVar31,auVar37);
        auVar38 = vmovdqu8_avx512bw(*(undefined1 (*) [64])((long)blob + uVar18));
        auVar41[1] = ((byte)(uVar24 >> 1) & 1) * auVar38[1];
        auVar41[0] = ((byte)uVar10 & 1) * auVar38[0];
        auVar41[2] = ((byte)(uVar24 >> 2) & 1) * auVar38[2];
        auVar41[3] = ((byte)(uVar24 >> 3) & 1) * auVar38[3];
        auVar41[4] = ((byte)(uVar24 >> 4) & 1) * auVar38[4];
        auVar41[5] = ((byte)(uVar24 >> 5) & 1) * auVar38[5];
        auVar41[6] = ((byte)(uVar24 >> 6) & 1) * auVar38[6];
        auVar41[7] = ((byte)(uVar24 >> 7) & 1) * auVar38[7];
        auVar41[8] = ((byte)uVar11 & 1) * auVar38[8];
        auVar41[9] = ((byte)(uVar24 >> 9) & 1) * auVar38[9];
        auVar41[10] = ((byte)(uVar24 >> 10) & 1) * auVar38[10];
        auVar41[0xb] = ((byte)(uVar24 >> 0xb) & 1) * auVar38[0xb];
        auVar41[0xc] = ((byte)(uVar24 >> 0xc) & 1) * auVar38[0xc];
        auVar41[0xd] = ((byte)(uVar24 >> 0xd) & 1) * auVar38[0xd];
        auVar41[0xe] = ((byte)(uVar24 >> 0xe) & 1) * auVar38[0xe];
        auVar41[0xf] = ((byte)(uVar24 >> 0xf) & 1) * auVar38[0xf];
        auVar41[0x10] = ((byte)uVar14 & 1) * auVar38[0x10];
        auVar41[0x11] = ((byte)(uVar24 >> 0x11) & 1) * auVar38[0x11];
        auVar41[0x12] = ((byte)(uVar24 >> 0x12) & 1) * auVar38[0x12];
        auVar41[0x13] = ((byte)(uVar24 >> 0x13) & 1) * auVar38[0x13];
        auVar41[0x14] = ((byte)(uVar24 >> 0x14) & 1) * auVar38[0x14];
        auVar41[0x15] = ((byte)(uVar24 >> 0x15) & 1) * auVar38[0x15];
        auVar41[0x16] = ((byte)(uVar24 >> 0x16) & 1) * auVar38[0x16];
        auVar41[0x17] = ((byte)(uVar24 >> 0x17) & 1) * auVar38[0x17];
        auVar41[0x18] = ((byte)uVar12 & 1) * auVar38[0x18];
        auVar41[0x19] = ((byte)(uVar24 >> 0x19) & 1) * auVar38[0x19];
        auVar41[0x1a] = ((byte)(uVar24 >> 0x1a) & 1) * auVar38[0x1a];
        auVar41[0x1b] = ((byte)(uVar24 >> 0x1b) & 1) * auVar38[0x1b];
        auVar41[0x1c] = ((byte)(uVar24 >> 0x1c) & 1) * auVar38[0x1c];
        auVar41[0x1d] = ((byte)(uVar24 >> 0x1d) & 1) * auVar38[0x1d];
        auVar41[0x1e] = ((byte)(uVar24 >> 0x1e) & 1) * auVar38[0x1e];
        auVar41[0x1f] = ((byte)(uVar24 >> 0x1f) & 1) * auVar38[0x1f];
        auVar41[0x20] = ((byte)uVar16 & 1) * auVar38[0x20];
        auVar41[0x21] = ((byte)(uVar21 >> 1) & 1) * auVar38[0x21];
        auVar41[0x22] = ((byte)(uVar21 >> 2) & 1) * auVar38[0x22];
        auVar41[0x23] = ((byte)(uVar21 >> 3) & 1) * auVar38[0x23];
        auVar41[0x24] = ((byte)(uVar21 >> 4) & 1) * auVar38[0x24];
        auVar41[0x25] = ((byte)(uVar21 >> 5) & 1) * auVar38[0x25];
        auVar41[0x26] = ((byte)(uVar21 >> 6) & 1) * auVar38[0x26];
        auVar41[0x27] = ((byte)(uVar21 >> 7) & 1) * auVar38[0x27];
        auVar41[0x28] = ((byte)uVar15 & 1) * auVar38[0x28];
        auVar41[0x29] = ((byte)(uVar21 >> 9) & 1) * auVar38[0x29];
        auVar41[0x2a] = ((byte)(uVar21 >> 10) & 1) * auVar38[0x2a];
        auVar41[0x2b] = ((byte)(uVar21 >> 0xb) & 1) * auVar38[0x2b];
        auVar41[0x2c] = ((byte)(uVar21 >> 0xc) & 1) * auVar38[0x2c];
        auVar41[0x2d] = ((byte)(uVar21 >> 0xd) & 1) * auVar38[0x2d];
        auVar41[0x2e] = ((byte)(uVar21 >> 0xe) & 1) * auVar38[0x2e];
        auVar41[0x2f] = ((byte)(uVar21 >> 0xf) & 1) * auVar38[0x2f];
        auVar41[0x30] = ((byte)uVar17 & 1) * auVar38[0x30];
        auVar41[0x31] = ((byte)(uVar22 >> 1) & 1) * auVar38[0x31];
        auVar41[0x32] = ((byte)(uVar22 >> 2) & 1) * auVar38[0x32];
        auVar41[0x33] = ((byte)(uVar22 >> 3) & 1) * auVar38[0x33];
        auVar41[0x34] = ((byte)(uVar22 >> 4) & 1) * auVar38[0x34];
        auVar41[0x35] = ((byte)(uVar22 >> 5) & 1) * auVar38[0x35];
        auVar41[0x36] = ((byte)(uVar22 >> 6) & 1) * auVar38[0x36];
        auVar41[0x37] = ((byte)(uVar22 >> 7) & 1) * auVar38[0x37];
        auVar41[0x38] = (bVar3 & 1) * auVar38[0x38];
        auVar41[0x39] = (bVar3 >> 1 & 1) * auVar38[0x39];
        auVar41[0x3a] = (bVar3 >> 2 & 1) * auVar38[0x3a];
        auVar41[0x3b] = (bVar3 >> 3 & 1) * auVar38[0x3b];
        auVar41[0x3c] = (bVar3 >> 4 & 1) * auVar38[0x3c];
        auVar41[0x3d] = (bVar3 >> 5 & 1) * auVar38[0x3d];
        auVar41[0x3e] = (bVar3 >> 6 & 1) * auVar38[0x3e];
        auVar41[0x3f] = -((char)bVar3 >> 7) * auVar38[0x3f];
        auVar31 = vpaddq_avx512f(auVar31,auVar35);
        uVar10 = vpcmpeqq_avx512f(auVar28,auVar37);
        auVar28 = vpaddq_avx512f(auVar28,auVar35);
        uVar11 = vpcmpeqq_avx512f(auVar29,auVar37);
        auVar29 = vpaddq_avx512f(auVar29,auVar35);
        uVar12 = vpcmpeqq_avx512f(auVar27,auVar37);
        auVar27 = vpaddq_avx512f(auVar27,auVar35);
        uVar20 = CONCAT44(CONCAT22(CONCAT11((char)uVar13,(char)uVar12),
                                   CONCAT11((char)uVar10,(char)uVar11)),
                          CONCAT22(CONCAT11((char)uVar6,(char)uVar9),
                                   CONCAT11((char)uVar7,(char)uVar8)));
        uVar23 = ~uVar20 & uVar24;
        auVar38 = vmovdqu8_avx512bw(*(undefined1 (*) [64])((long)blob + uVar18 + 1));
        bVar3 = (byte)(uVar23 >> 0x38);
        uVar24 = uVar24 & uVar20;
        auVar39 = vmovdqu8_avx512bw(auVar25);
        bVar2 = (bool)((byte)uVar24 & 1);
        auVar40[0] = bVar2 * auVar39[0] | !bVar2 * ((byte)uVar23 & 1) * auVar38[0];
        bVar2 = (bool)((byte)(uVar24 >> 1) & 1);
        auVar40[1] = bVar2 * auVar39[1] | !bVar2 * ((byte)(uVar23 >> 1) & 1) * auVar38[1];
        bVar2 = (bool)((byte)(uVar24 >> 2) & 1);
        auVar40[2] = bVar2 * auVar39[2] | !bVar2 * ((byte)(uVar23 >> 2) & 1) * auVar38[2];
        bVar2 = (bool)((byte)(uVar24 >> 3) & 1);
        auVar40[3] = bVar2 * auVar39[3] | !bVar2 * ((byte)(uVar23 >> 3) & 1) * auVar38[3];
        bVar2 = (bool)((byte)(uVar24 >> 4) & 1);
        auVar40[4] = bVar2 * auVar39[4] | !bVar2 * ((byte)(uVar23 >> 4) & 1) * auVar38[4];
        bVar2 = (bool)((byte)(uVar24 >> 5) & 1);
        auVar40[5] = bVar2 * auVar39[5] | !bVar2 * ((byte)(uVar23 >> 5) & 1) * auVar38[5];
        bVar2 = (bool)((byte)(uVar24 >> 6) & 1);
        auVar40[6] = bVar2 * auVar39[6] | !bVar2 * ((byte)(uVar23 >> 6) & 1) * auVar38[6];
        bVar2 = (bool)((byte)(uVar24 >> 7) & 1);
        auVar40[7] = bVar2 * auVar39[7] | !bVar2 * ((byte)(uVar23 >> 7) & 1) * auVar38[7];
        bVar2 = (bool)((byte)(uVar24 >> 8) & 1);
        auVar40[8] = bVar2 * auVar39[8] | !bVar2 * ((byte)(uVar23 >> 8) & 1) * auVar38[8];
        bVar2 = (bool)((byte)(uVar24 >> 9) & 1);
        auVar40[9] = bVar2 * auVar39[9] | !bVar2 * ((byte)(uVar23 >> 9) & 1) * auVar38[9];
        bVar2 = (bool)((byte)(uVar24 >> 10) & 1);
        auVar40[10] = bVar2 * auVar39[10] | !bVar2 * ((byte)(uVar23 >> 10) & 1) * auVar38[10];
        bVar2 = (bool)((byte)(uVar24 >> 0xb) & 1);
        auVar40[0xb] = bVar2 * auVar39[0xb] | !bVar2 * ((byte)(uVar23 >> 0xb) & 1) * auVar38[0xb];
        bVar2 = (bool)((byte)(uVar24 >> 0xc) & 1);
        auVar40[0xc] = bVar2 * auVar39[0xc] | !bVar2 * ((byte)(uVar23 >> 0xc) & 1) * auVar38[0xc];
        bVar2 = (bool)((byte)(uVar24 >> 0xd) & 1);
        auVar40[0xd] = bVar2 * auVar39[0xd] | !bVar2 * ((byte)(uVar23 >> 0xd) & 1) * auVar38[0xd];
        bVar2 = (bool)((byte)(uVar24 >> 0xe) & 1);
        auVar40[0xe] = bVar2 * auVar39[0xe] | !bVar2 * ((byte)(uVar23 >> 0xe) & 1) * auVar38[0xe];
        bVar2 = (bool)((byte)(uVar24 >> 0xf) & 1);
        auVar40[0xf] = bVar2 * auVar39[0xf] | !bVar2 * ((byte)(uVar23 >> 0xf) & 1) * auVar38[0xf];
        bVar2 = (bool)((byte)(uVar24 >> 0x10) & 1);
        auVar40[0x10] =
             bVar2 * auVar39[0x10] | !bVar2 * ((byte)(uVar23 >> 0x10) & 1) * auVar38[0x10];
        bVar2 = (bool)((byte)(uVar24 >> 0x11) & 1);
        auVar40[0x11] =
             bVar2 * auVar39[0x11] | !bVar2 * ((byte)(uVar23 >> 0x11) & 1) * auVar38[0x11];
        bVar2 = (bool)((byte)(uVar24 >> 0x12) & 1);
        auVar40[0x12] =
             bVar2 * auVar39[0x12] | !bVar2 * ((byte)(uVar23 >> 0x12) & 1) * auVar38[0x12];
        bVar2 = (bool)((byte)(uVar24 >> 0x13) & 1);
        auVar40[0x13] =
             bVar2 * auVar39[0x13] | !bVar2 * ((byte)(uVar23 >> 0x13) & 1) * auVar38[0x13];
        bVar2 = (bool)((byte)(uVar24 >> 0x14) & 1);
        auVar40[0x14] =
             bVar2 * auVar39[0x14] | !bVar2 * ((byte)(uVar23 >> 0x14) & 1) * auVar38[0x14];
        bVar2 = (bool)((byte)(uVar24 >> 0x15) & 1);
        auVar40[0x15] =
             bVar2 * auVar39[0x15] | !bVar2 * ((byte)(uVar23 >> 0x15) & 1) * auVar38[0x15];
        bVar2 = (bool)((byte)(uVar24 >> 0x16) & 1);
        auVar40[0x16] =
             bVar2 * auVar39[0x16] | !bVar2 * ((byte)(uVar23 >> 0x16) & 1) * auVar38[0x16];
        bVar2 = (bool)((byte)(uVar24 >> 0x17) & 1);
        auVar40[0x17] =
             bVar2 * auVar39[0x17] | !bVar2 * ((byte)(uVar23 >> 0x17) & 1) * auVar38[0x17];
        bVar2 = (bool)((byte)(uVar24 >> 0x18) & 1);
        auVar40[0x18] =
             bVar2 * auVar39[0x18] | !bVar2 * ((byte)(uVar23 >> 0x18) & 1) * auVar38[0x18];
        bVar2 = (bool)((byte)(uVar24 >> 0x19) & 1);
        auVar40[0x19] =
             bVar2 * auVar39[0x19] | !bVar2 * ((byte)(uVar23 >> 0x19) & 1) * auVar38[0x19];
        bVar2 = (bool)((byte)(uVar24 >> 0x1a) & 1);
        auVar40[0x1a] =
             bVar2 * auVar39[0x1a] | !bVar2 * ((byte)(uVar23 >> 0x1a) & 1) * auVar38[0x1a];
        bVar2 = (bool)((byte)(uVar24 >> 0x1b) & 1);
        auVar40[0x1b] =
             bVar2 * auVar39[0x1b] | !bVar2 * ((byte)(uVar23 >> 0x1b) & 1) * auVar38[0x1b];
        bVar2 = (bool)((byte)(uVar24 >> 0x1c) & 1);
        auVar40[0x1c] =
             bVar2 * auVar39[0x1c] | !bVar2 * ((byte)(uVar23 >> 0x1c) & 1) * auVar38[0x1c];
        bVar2 = (bool)((byte)(uVar24 >> 0x1d) & 1);
        auVar40[0x1d] =
             bVar2 * auVar39[0x1d] | !bVar2 * ((byte)(uVar23 >> 0x1d) & 1) * auVar38[0x1d];
        bVar2 = (bool)((byte)(uVar24 >> 0x1e) & 1);
        auVar40[0x1e] =
             bVar2 * auVar39[0x1e] | !bVar2 * ((byte)(uVar23 >> 0x1e) & 1) * auVar38[0x1e];
        bVar2 = (bool)((byte)(uVar24 >> 0x1f) & 1);
        auVar40[0x1f] =
             bVar2 * auVar39[0x1f] | !bVar2 * ((byte)(uVar23 >> 0x1f) & 1) * auVar38[0x1f];
        bVar2 = (bool)((byte)(uVar24 >> 0x20) & 1);
        auVar40[0x20] =
             bVar2 * auVar39[0x20] | !bVar2 * ((byte)(uVar23 >> 0x20) & 1) * auVar38[0x20];
        bVar2 = (bool)((byte)(uVar24 >> 0x21) & 1);
        auVar40[0x21] =
             bVar2 * auVar39[0x21] | !bVar2 * ((byte)(uVar23 >> 0x21) & 1) * auVar38[0x21];
        bVar2 = (bool)((byte)(uVar24 >> 0x22) & 1);
        auVar40[0x22] =
             bVar2 * auVar39[0x22] | !bVar2 * ((byte)(uVar23 >> 0x22) & 1) * auVar38[0x22];
        bVar2 = (bool)((byte)(uVar24 >> 0x23) & 1);
        auVar40[0x23] =
             bVar2 * auVar39[0x23] | !bVar2 * ((byte)(uVar23 >> 0x23) & 1) * auVar38[0x23];
        bVar2 = (bool)((byte)(uVar24 >> 0x24) & 1);
        auVar40[0x24] =
             bVar2 * auVar39[0x24] | !bVar2 * ((byte)(uVar23 >> 0x24) & 1) * auVar38[0x24];
        bVar2 = (bool)((byte)(uVar24 >> 0x25) & 1);
        auVar40[0x25] =
             bVar2 * auVar39[0x25] | !bVar2 * ((byte)(uVar23 >> 0x25) & 1) * auVar38[0x25];
        bVar2 = (bool)((byte)(uVar24 >> 0x26) & 1);
        auVar40[0x26] =
             bVar2 * auVar39[0x26] | !bVar2 * ((byte)(uVar23 >> 0x26) & 1) * auVar38[0x26];
        bVar2 = (bool)((byte)(uVar24 >> 0x27) & 1);
        auVar40[0x27] =
             bVar2 * auVar39[0x27] | !bVar2 * ((byte)(uVar23 >> 0x27) & 1) * auVar38[0x27];
        bVar2 = (bool)((byte)(uVar24 >> 0x28) & 1);
        auVar40[0x28] =
             bVar2 * auVar39[0x28] | !bVar2 * ((byte)(uVar23 >> 0x28) & 1) * auVar38[0x28];
        bVar2 = (bool)((byte)(uVar24 >> 0x29) & 1);
        auVar40[0x29] =
             bVar2 * auVar39[0x29] | !bVar2 * ((byte)(uVar23 >> 0x29) & 1) * auVar38[0x29];
        bVar2 = (bool)((byte)(uVar24 >> 0x2a) & 1);
        auVar40[0x2a] =
             bVar2 * auVar39[0x2a] | !bVar2 * ((byte)(uVar23 >> 0x2a) & 1) * auVar38[0x2a];
        bVar2 = (bool)((byte)(uVar24 >> 0x2b) & 1);
        auVar40[0x2b] =
             bVar2 * auVar39[0x2b] | !bVar2 * ((byte)(uVar23 >> 0x2b) & 1) * auVar38[0x2b];
        bVar2 = (bool)((byte)(uVar24 >> 0x2c) & 1);
        auVar40[0x2c] =
             bVar2 * auVar39[0x2c] | !bVar2 * ((byte)(uVar23 >> 0x2c) & 1) * auVar38[0x2c];
        bVar2 = (bool)((byte)(uVar24 >> 0x2d) & 1);
        auVar40[0x2d] =
             bVar2 * auVar39[0x2d] | !bVar2 * ((byte)(uVar23 >> 0x2d) & 1) * auVar38[0x2d];
        bVar2 = (bool)((byte)(uVar24 >> 0x2e) & 1);
        auVar40[0x2e] =
             bVar2 * auVar39[0x2e] | !bVar2 * ((byte)(uVar23 >> 0x2e) & 1) * auVar38[0x2e];
        bVar2 = (bool)((byte)(uVar24 >> 0x2f) & 1);
        auVar40[0x2f] =
             bVar2 * auVar39[0x2f] | !bVar2 * ((byte)(uVar23 >> 0x2f) & 1) * auVar38[0x2f];
        bVar2 = (bool)((byte)(uVar24 >> 0x30) & 1);
        auVar40[0x30] =
             bVar2 * auVar39[0x30] | !bVar2 * ((byte)(uVar23 >> 0x30) & 1) * auVar38[0x30];
        bVar2 = (bool)((byte)(uVar24 >> 0x31) & 1);
        auVar40[0x31] =
             bVar2 * auVar39[0x31] | !bVar2 * ((byte)(uVar23 >> 0x31) & 1) * auVar38[0x31];
        bVar2 = (bool)((byte)(uVar24 >> 0x32) & 1);
        auVar40[0x32] =
             bVar2 * auVar39[0x32] | !bVar2 * ((byte)(uVar23 >> 0x32) & 1) * auVar38[0x32];
        bVar2 = (bool)((byte)(uVar24 >> 0x33) & 1);
        auVar40[0x33] =
             bVar2 * auVar39[0x33] | !bVar2 * ((byte)(uVar23 >> 0x33) & 1) * auVar38[0x33];
        bVar2 = (bool)((byte)(uVar24 >> 0x34) & 1);
        auVar40[0x34] =
             bVar2 * auVar39[0x34] | !bVar2 * ((byte)(uVar23 >> 0x34) & 1) * auVar38[0x34];
        bVar2 = (bool)((byte)(uVar24 >> 0x35) & 1);
        auVar40[0x35] =
             bVar2 * auVar39[0x35] | !bVar2 * ((byte)(uVar23 >> 0x35) & 1) * auVar38[0x35];
        bVar2 = (bool)((byte)(uVar24 >> 0x36) & 1);
        auVar40[0x36] =
             bVar2 * auVar39[0x36] | !bVar2 * ((byte)(uVar23 >> 0x36) & 1) * auVar38[0x36];
        bVar2 = (bool)((byte)(uVar24 >> 0x37) & 1);
        auVar40[0x37] =
             bVar2 * auVar39[0x37] | !bVar2 * ((byte)(uVar23 >> 0x37) & 1) * auVar38[0x37];
        bVar4 = (byte)(uVar24 >> 0x38);
        auVar40[0x38] =
             (bVar4 & 1) * auVar39[0x38] | !(bool)(bVar4 & 1) * (bVar3 & 1) * auVar38[0x38];
        bVar2 = (bool)(bVar4 >> 1 & 1);
        auVar40[0x39] = bVar2 * auVar39[0x39] | !bVar2 * (bVar3 >> 1 & 1) * auVar38[0x39];
        bVar2 = (bool)(bVar4 >> 2 & 1);
        auVar40[0x3a] = bVar2 * auVar39[0x3a] | !bVar2 * (bVar3 >> 2 & 1) * auVar38[0x3a];
        bVar2 = (bool)(bVar4 >> 3 & 1);
        auVar40[0x3b] = bVar2 * auVar39[0x3b] | !bVar2 * (bVar3 >> 3 & 1) * auVar38[0x3b];
        bVar2 = (bool)(bVar4 >> 4 & 1);
        auVar40[0x3c] = bVar2 * auVar39[0x3c] | !bVar2 * (bVar3 >> 4 & 1) * auVar38[0x3c];
        bVar2 = (bool)(bVar4 >> 5 & 1);
        auVar40[0x3d] = bVar2 * auVar39[0x3d] | !bVar2 * (bVar3 >> 5 & 1) * auVar38[0x3d];
        bVar2 = (bool)(bVar4 >> 6 & 1);
        auVar40[0x3e] = bVar2 * auVar39[0x3e] | !bVar2 * (bVar3 >> 6 & 1) * auVar38[0x3e];
        auVar40[0x3f] =
             -((char)bVar4 >> 7) * auVar39[0x3f] |
             !(bool)-((char)bVar4 >> 7) * -((char)bVar3 >> 7) * auVar38[0x3f];
        auVar38 = vpunpckhbw_avx512bw(auVar41,auVar40);
        auVar41 = vpunpcklbw_avx512bw(auVar41,auVar40);
        auVar38 = vpsrlw_avx512bw(auVar38,auVar5);
        auVar41 = vpsrlw_avx512bw(auVar41,auVar5);
        auVar38 = vpermt2b_avx512_vbmi(auVar41,auVar34,auVar38);
        auVar38 = vmovdqu8_avx512bw(auVar38);
        *(undefined1 (*) [64])((long)blob + uVar18) = auVar38;
        uVar18 = uVar18 + 0x40;
      } while ((len + 0x3fU & 0xffffffc0) != uVar18);
    }
  }
  return;
}

Assistant:

void rrot8 ( void * blob, int len, int c )
{
  int nbytes  = len;

  uint8_t * k = (uint8_t*)blob;

  if(c == 0) return;

  //----------

  int b = c / 8;
  c &= (8-1);

  for(int j = 0; j < b; j++)
  {
    uint8_t t = k[0];

    for(int i = 0; i < nbytes-1; i++)
    {
      k[i] = k[i+1];
    }

    k[nbytes-1] = t;
  }

  if(c == 0) return;

  //----------

  uint8_t t = k[0];

  for(int i = 0; i < nbytes; i++)
  {
    uint8_t a = (i == nbytes-1) ? t : k[i+1];
    uint8_t b = k[i];

    k[i] = (a << (8-c)) | (b >> c);
  }
}